

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

bool __thiscall QXmlStreamReader::readNextStartElement(QXmlStreamReader *this)

{
  TokenType TVar1;
  uint uVar2;
  
  do {
    TVar1 = readNext(this);
    if (TVar1 == Invalid) {
      uVar2 = 0;
      break;
    }
    uVar2 = ((this->d_ptr)._M_t.
             super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
             .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl)->type -
            EndDocument;
  } while (2 < uVar2);
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool QXmlStreamReader::readNextStartElement()
{
    while (readNext() != Invalid) {
        if (isEndElement() || isEndDocument())
            return false;
        else if (isStartElement())
            return true;
    }
    return false;
}